

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cmCryptoHash::ByteHashFile
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cmCryptoHash *this,string *file)

{
  ifstream fin;
  uint64_t buffer [512];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1248;
  long local_1230;
  int local_1228;
  byte abStack_1210 [488];
  undefined1 local_1028 [4104];
  
  std::ifstream::ifstream(&local_1230,(file->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_1210[*(long *)(local_1230 + -0x18)] & 5) == 0) {
    rhash_reset(this->CTX);
    if ((abStack_1210[*(long *)(local_1230 + -0x18)] & 5) == 0) {
      do {
        std::istream::read((char *)&local_1230,(long)local_1028);
        if (local_1228 != 0) {
          rhash_update(this->CTX,local_1028,(long)local_1228);
        }
      } while ((abStack_1210[*(long *)(local_1230 + -0x18)] & 5) == 0);
    }
    if ((abStack_1210[*(long *)(local_1230 + -0x18)] & 2) != 0) {
      Finalize(__return_storage_ptr__,this);
      goto LAB_0011b095;
    }
    Finalize(&local_1248,this);
    if (local_1248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1248.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1248.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1248.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0011b095:
  std::ifstream::~ifstream(&local_1230);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> cmCryptoHash::ByteHashFile(const std::string& file)
{
  cmsys::ifstream fin(file.c_str(), std::ios::in | std::ios::binary);
  if (fin) {
    this->Initialize();
    {
      // Should be efficient enough on most system:
      KWIML_INT_uint64_t buffer[512];
      char* buffer_c = reinterpret_cast<char*>(buffer);
      unsigned char const* buffer_uc =
        reinterpret_cast<unsigned char const*>(buffer);
      // This copy loop is very sensitive on certain platforms with
      // slightly broken stream libraries (like HPUX).  Normally, it is
      // incorrect to not check the error condition on the fin.read()
      // before using the data, but the fin.gcount() will be zero if an
      // error occurred.  Therefore, the loop should be safe everywhere.
      while (fin) {
        fin.read(buffer_c, sizeof(buffer));
        if (int gcount = static_cast<int>(fin.gcount())) {
          this->Append(buffer_uc, gcount);
        }
      }
    }
    if (fin.eof()) {
      // Success
      return this->Finalize();
    }
    // Finalize anyway
    this->Finalize();
  }
  // Return without success
  return std::vector<unsigned char>();
}